

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

int identify_pack(int id_limit)

{
  boolean bVar1;
  uint uVar2;
  obj *otmp;
  int iVar3;
  ulong uVar4;
  char *line;
  long lVar5;
  ulong uVar6;
  obj *poVar7;
  int iVar8;
  int iVar9;
  object_pick *pick_list;
  char buf [256];
  object_pick *local_140;
  char local_138 [264];
  
  if (invent == (obj *)0x0) {
LAB_001b137d:
    line = "You have already identified all of your possessions.";
    iVar8 = 0;
  }
  else {
    uVar4 = (ulong)(uint)id_limit;
    iVar8 = 0;
    otmp = (obj *)0x0;
    poVar7 = invent;
    do {
      bVar1 = not_fully_identified(poVar7);
      if (bVar1 != '\0') {
        otmp = poVar7;
      }
      iVar8 = iVar8 + (uint)(bVar1 != '\0');
      poVar7 = poVar7->nobj;
    } while (poVar7 != (obj *)0x0);
    if (iVar8 == 0) goto LAB_001b137d;
    if (id_limit == 0) {
      if (iVar8 == 1) {
        fully_identify_obj(otmp);
        prinv((char *)0x0,otmp,0);
        iVar8 = 1;
      }
      else {
        iVar8 = 0;
        for (poVar7 = invent; poVar7 != (obj *)0x0; poVar7 = poVar7->nobj) {
          bVar1 = not_fully_identified(poVar7);
          if (bVar1 != '\0') {
            fully_identify_obj(poVar7);
            prinv((char *)0x0,poVar7,0);
            iVar8 = iVar8 + 1;
          }
        }
      }
      goto LAB_001b138d;
    }
    iVar8 = 0;
    sprintf(local_138,"What would you like to identify %s?","first");
    uVar2 = query_objlist(local_138,invent,0x1c,&local_140,2,not_fully_identified);
    if (0 < (int)uVar2) {
      iVar8 = 0;
      do {
        iVar3 = (int)uVar4;
        uVar6 = (ulong)uVar2;
        if (iVar3 <= (int)uVar2) {
          uVar6 = uVar4;
        }
        if (iVar3 < 1) {
          free(local_140);
        }
        else {
          iVar9 = (int)uVar6;
          lVar5 = 0;
          do {
            poVar7 = *(obj **)((long)&local_140->obj + lVar5);
            fully_identify_obj(poVar7);
            prinv((char *)0x0,poVar7,0);
            lVar5 = lVar5 + 0x10;
            uVar6 = uVar6 - 1;
          } while (uVar6 != 0);
          iVar8 = iVar8 + iVar9;
          free(local_140);
          uVar2 = iVar3 - iVar9;
          uVar4 = (ulong)uVar2;
          if (uVar2 == 0) goto LAB_001b138d;
        }
        (*windowprocs.win_pause)(P_MESSAGE);
        sprintf(local_138,"What would you like to identify %s?","next");
        uVar2 = query_objlist(local_138,invent,0x1c,&local_140,2,not_fully_identified);
      } while (0 < (int)uVar2);
    }
    if (-1 < (int)uVar2) goto LAB_001b138d;
    line = "That was all.";
  }
  pline(line);
LAB_001b138d:
  update_inventory();
  return iVar8;
}

Assistant:

int identify_pack(int id_limit)
{
    struct obj *obj, *the_obj;
    int unid_cnt;
    int num_identified = 0;

    unid_cnt = 0;
    the_obj = 0;		/* if unid_cnt ends up 1, this will be it */
    for (obj = invent; obj; obj = obj->nobj)
	if (not_fully_identified(obj)) ++unid_cnt, the_obj = obj;

    if (!unid_cnt) {
	pline("You have already identified all of your possessions.");
    } else if (!id_limit) {
	/* identify everything */
	if (unid_cnt == 1) {
	    identify(the_obj);
	    num_identified = 1;
	} else {
	    /* TODO:  use fully_identify_obj and cornline/menu/whatever here */
	    for (obj = invent; obj; obj = obj->nobj) {
		if (not_fully_identified(obj)) {
		    identify(obj);
		    num_identified++;
		}
	    }
	}
    } else {
	/* identify up to `id_limit' items */
	num_identified = menu_identify(id_limit);
    }
    update_inventory();

    return num_identified;
}